

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall
kratos::CheckFlipFlopAlwaysFFVisitor::visit(CheckFlipFlopAlwaysFFVisitor *this,Generator *gen)

{
  pointer psVar1;
  pointer psVar2;
  long lVar3;
  undefined1 local_60 [8];
  shared_ptr<kratos::Stmt> stmt;
  shared_ptr<kratos::StmtBlock> block;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  psVar1 = (gen->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (gen->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar3 = 0; (long)psVar1 - (long)psVar2 >> 4 != lVar3; lVar3 = lVar3 + 1) {
    Generator::get_stmt((Generator *)local_60,(uint32_t)gen);
    if (*(int *)((long)local_60 + 0x78) == 4) {
      Stmt::as<kratos::StmtBlock>
                ((Stmt *)&stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xd].
          _M_use_count == 1) {
        Stmt::as<kratos::SequentialStmtBlock>
                  ((Stmt *)&block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        check_always_ff((SequentialStmtBlock *)
                        block.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&block);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  }
  return;
}

Assistant:

void visit(Generator* gen) override {
        uint64_t stmt_count = gen->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = gen->get_stmt(i);
            if (stmt->type() == StatementType::Block) {
                auto block = stmt->as<StmtBlock>();
                if (block->block_type() == StatementBlockType::Sequential) {
                    check_always_ff(block->as<SequentialStmtBlock>().get());
                }
            }
        }
    }